

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadrilateral.h
# Opt level: O1

double __thiscall
ZXing::Quadrilateral<ZXing::PointT<int>_>::orientation(Quadrilateral<ZXing::PointT<int>_> *this)

{
  PointT<int> PVar1;
  PointT<int> PVar2;
  PointT<int> PVar3;
  PointT<int> PVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  PVar1 = (this->super_array<ZXing::PointT<int>,_4UL>)._M_elems[0];
  PVar2 = (this->super_array<ZXing::PointT<int>,_4UL>)._M_elems[1];
  PVar3 = (this->super_array<ZXing::PointT<int>,_4UL>)._M_elems[2];
  iVar6 = PVar3.y + PVar2.y;
  PVar4 = (this->super_array<ZXing::PointT<int>,_4UL>)._M_elems[3];
  iVar7 = PVar4.y + PVar1.y;
  iVar5 = (PVar3.x + PVar2.x) - (PVar1.x + PVar4.x);
  if ((iVar5 == 0) && (iVar6 == iVar7)) {
    return 0.0;
  }
  dVar9 = (double)iVar5;
  dVar10 = (double)(iVar6 - iVar7);
  dVar8 = dVar9 * dVar9 + dVar10 * dVar10;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar8 = atan2(dVar10 / dVar8,dVar9 / dVar8);
  return dVar8;
}

Assistant:

constexpr Point topRight() const noexcept { return at(1); }